

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node>::
Attribute_Access(Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node> *this,
                offset_in_AST_Node_to_unknown t_attr)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator<chaiscript::Type_Info> local_79;
  Type_Info local_78;
  pointer_____offset_0x10___ *ppuStack_60;
  pointer_____offset_0x10___ *local_58;
  undefined8 uStack_50;
  iterator local_40;
  size_type local_38;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  offset_in_AST_Node_to_unknown local_18;
  offset_in_AST_Node_to_unknown t_attr_local;
  Attribute_Access<const_chaiscript::AST_Node_Type,_chaiscript::AST_Node> *this_local;
  
  local_18 = t_attr;
  t_attr_local = (offset_in_AST_Node_to_unknown)this;
  param_types();
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_30,1);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_30);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Attribute_Access_00883c10;
  local_58 = &AST_Node::typeinfo;
  uStack_50 = 0;
  local_78.m_flags = 1;
  local_78._20_4_ = 0;
  ppuStack_60 = &AST_Node::typeinfo;
  local_78.m_type_info = (type_info *)&AST_Node_Type::typeinfo;
  local_78.m_bare_type_info = (type_info *)&AST_Node_Type::typeinfo;
  local_40 = &local_78;
  local_38 = 2;
  std::allocator<chaiscript::Type_Info>::allocator(&local_79);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&this->m_param_types,__l,&local_79);
  std::allocator<chaiscript::Type_Info>::~allocator(&local_79);
  this->m_attr = local_18;
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }